

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tchostsi.cpp
# Opt level: O3

void __thiscall CTcHostIfcStdio::v_printf(CTcHostIfcStdio *this,char *msg,__va_list_tag *args)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  char xlat_buf [1024];
  char buf [1024];
  char acStack_808 [1024];
  char local_408 [1032];
  
  t3vsprintf(local_408,0x400,msg,args);
  if (CTcMain::console_mapper_ == (CCharmapToLocal *)0x0) {
    pcVar2 = local_408;
  }
  else {
    iVar1 = (*(CTcMain::console_mapper_->super_CCharmap)._vptr_CCharmap[5])
                      (CTcMain::console_mapper_,acStack_808,0x400,local_408,
                       CCharmapToLocal::source_esc_cb);
    pcVar2 = acStack_808;
    if (CONCAT44(extraout_var,iVar1) < 0x400) {
      acStack_808[CONCAT44(extraout_var,iVar1)] = '\0';
      pcVar2 = acStack_808;
    }
  }
  printf("%s",pcVar2);
  fflush(_stdout);
  return;
}

Assistant:

void CTcHostIfcStdio::v_printf(const char *msg, va_list args)
{
    char buf[1024];
    
    /* format the message to our internal buffer */
    t3vsprintf(buf, sizeof(buf), msg, args);

    /* translate to the local character set if we have a mapper */
    if (G_tcmain->get_console_mapper() != 0)
    {
        char xlat_buf[1024];
        utf8_ptr p;
        size_t len;

        /* translate it */
        p.set(buf);
        len = G_tcmain->get_console_mapper()
              ->map_utf8z_esc(xlat_buf, sizeof(xlat_buf), p,
                              &CCharmapToLocal::source_esc_cb);

        /* if there's room, null-terminate the buffer */
        if (len < sizeof(xlat_buf))
            xlat_buf[len] = '\0';
        
        /* display it on the standard output */
        printf("%s", xlat_buf);
    }
    else
    {
        /* there's no character mapper - display the untranslated buffer */
        printf("%s", buf);
    }

    /* 
     *   Flush the standard output immediately.  If our output is being
     *   redirected to a pipe that another program is reading, this will
     *   ensure that the other program will see our output as soon as we
     *   produce it, which might be important in some cases.  In any case,
     *   we don't generally produce so much console output that this should
     *   significantly affect performance.  
     */
    fflush(stdout);
}